

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_tointg(ASMState *as,IRIns *ir,Reg left)

{
  Reg r2;
  Reg r2_00;
  Reg in_EDX;
  ASMState *in_RDI;
  Reg dest;
  Reg tmp;
  undefined4 in_stack_ffffffffffffffd8;
  RegSet in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  r2 = ra_scratch((ASMState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc);
  r2_00 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (IRIns *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  asm_guardcc((ASMState *)CONCAT44(in_EDX,r2),r2_00);
  asm_guardcc((ASMState *)CONCAT44(in_EDX,r2),r2_00);
  emit_rr(in_RDI,XO_UCOMISD,in_EDX,r2);
  emit_rr(in_RDI,XO_CVTSI2SD,r2,r2_00);
  if ((in_RDI->flags & 0x400) == 0) {
    emit_rr(in_RDI,XO_XORPS,r2,r2);
  }
  emit_rr(in_RDI,XO_CVTTSD2SI,r2_00,in_EDX);
  return;
}

Assistant:

static void asm_tointg(ASMState *as, IRIns *ir, Reg left)
{
  Reg tmp = ra_scratch(as, rset_exclude(RSET_FPR, left));
  Reg dest = ra_dest(as, ir, RSET_GPR);
  asm_guardcc(as, CC_P);
  asm_guardcc(as, CC_NE);
  emit_rr(as, XO_UCOMISD, left, tmp);
  emit_rr(as, XO_CVTSI2SD, tmp, dest);
  if (!(as->flags & JIT_F_SPLIT_XMM))
    emit_rr(as, XO_XORPS, tmp, tmp);  /* Avoid partial register stall. */
  emit_rr(as, XO_CVTTSD2SI, dest, left);
  /* Can't fuse since left is needed twice. */
}